

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldst_helper.c
# Opt level: O0

void demap_tlb(SparcTLBEntry *tlb,target_ulong demap_addr,char *strmmu,CPUSPARCState_conflict1 *env1
              )

{
  int iVar1;
  uint64_t uStack_40;
  int is_demap_context;
  uint64_t context;
  target_ulong mask;
  uint i;
  CPUSPARCState_conflict1 *env1_local;
  char *strmmu_local;
  target_ulong demap_addr_local;
  SparcTLBEntry *tlb_local;
  
  strmmu_local._0_4_ = (uint)demap_addr;
  switch((uint)strmmu_local >> 4 & 3) {
  case 0:
    uStack_40 = (env1->dmmu).mmuregs[1];
    break;
  case 1:
    uStack_40 = (env1->dmmu).mmuregs[2];
    break;
  case 2:
    uStack_40 = 0;
    break;
  case 3:
  default:
    goto switchD_00e5af9a_default;
  }
  for (mask._4_4_ = 0; mask._4_4_ < 0x40; mask._4_4_ = mask._4_4_ + 1) {
    if ((tlb[mask._4_4_].tte & 0x8000000000000000) != 0) {
      if (((uint)strmmu_local >> 6 & 1) == 0) {
        iVar1 = compare_masked(demap_addr,tlb[mask._4_4_].tag,
                               -0x2000L << ((byte)(tlb[mask._4_4_].tte >> 0x3d) & 3) * '\x03');
        if (iVar1 != 0) {
          if ((tlb[mask._4_4_].tte & 1) == 0) {
            iVar1 = tlb_compare_context(tlb + mask._4_4_,uStack_40);
            goto joined_r0x00e5b0da;
          }
LAB_00e5b0e0:
          replace_tlb_entry(tlb + mask._4_4_,0,0,env1);
        }
      }
      else if ((tlb[mask._4_4_].tte & 1) == 0) {
        iVar1 = tlb_compare_context(tlb + mask._4_4_,uStack_40);
joined_r0x00e5b0da:
        if (iVar1 != 0) goto LAB_00e5b0e0;
      }
    }
  }
switchD_00e5af9a_default:
  return;
}

Assistant:

static void demap_tlb(SparcTLBEntry *tlb, target_ulong demap_addr,
                      const char *strmmu, CPUSPARCState *env1)
{
    unsigned int i;
    target_ulong mask;
    uint64_t context;

    int is_demap_context = (demap_addr >> 6) & 1;

    /* demap context */
    switch ((demap_addr >> 4) & 3) {
    case 0: /* primary */
        context = env1->dmmu.mmu_primary_context;
        break;
    case 1: /* secondary */
        context = env1->dmmu.mmu_secondary_context;
        break;
    case 2: /* nucleus */
        context = 0;
        break;
    case 3: /* reserved */
    default:
        return;
    }

    for (i = 0; i < 64; i++) {
        if (TTE_IS_VALID(tlb[i].tte)) {

            if (is_demap_context) {
                /* will remove non-global entries matching context value */
                if (TTE_IS_GLOBAL(tlb[i].tte) ||
                    !tlb_compare_context(&tlb[i], context)) {
                    continue;
                }
            } else {
                /* demap page
                   will remove any entry matching VA */
                mask = 0xffffffffffffe000ULL;
                mask <<= 3 * ((tlb[i].tte >> 61) & 3);

                if (!compare_masked(demap_addr, tlb[i].tag, mask)) {
                    continue;
                }

                /* entry should be global or matching context value */
                if (!TTE_IS_GLOBAL(tlb[i].tte) &&
                    !tlb_compare_context(&tlb[i], context)) {
                    continue;
                }
            }

            replace_tlb_entry(&tlb[i], 0, 0, env1);
#ifdef DEBUG_MMU
            DPRINTF_MMU("%s demap invalidated entry [%02u]\n", strmmu, i);
            dump_mmu(env1);
#endif
        }
    }
}